

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_> *
Scene::GetVertexAttributeDescriptions(void)

{
  value_type *__val;
  pointer pVVar1;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  *in_RDI;
  
  (in_RDI->
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar1 = (pointer)operator_new(0x20);
  (in_RDI->
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  )._M_impl.super__Vector_impl_data._M_start = pVVar1;
  (in_RDI->
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  )._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  (in_RDI->
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar1 + 2;
  pVVar1->location = 0;
  pVVar1->binding = 0;
  pVVar1->format = VK_FORMAT_UNDEFINED;
  pVVar1->offset = 0;
  pVVar1[1].location = 0;
  pVVar1[1].binding = 0;
  pVVar1[1].format = VK_FORMAT_UNDEFINED;
  pVVar1[1].offset = 0;
  (in_RDI->
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  )._M_impl.super__Vector_impl_data._M_finish = pVVar1 + 2;
  pVVar1->location = 0;
  pVVar1->binding = 0;
  pVVar1->format = VK_FORMAT_R32G32B32_SFLOAT;
  pVVar1->offset = 0;
  pVVar1[1].location = 1;
  pVVar1[1].binding = 0;
  pVVar1[1].format = VK_FORMAT_R32G32_SFLOAT;
  pVVar1[1].offset = 0xc;
  return in_RDI;
}

Assistant:

std::vector<VkVertexInputAttributeDescription> Scene::GetVertexAttributeDescriptions() {
	std::vector<VkVertexInputAttributeDescription> ret(2);
	ret[0].binding = 0;
	ret[0].location = 0;
	ret[0].format = VK_FORMAT_R32G32B32_SFLOAT;
	ret[0].offset = offsetof(Vertex, m_position);

	ret[1].binding = 0;
	ret[1].location = 1;
	ret[1].format = VK_FORMAT_R32G32_SFLOAT;
	ret[1].offset = offsetof(Vertex, m_texcoord);

	return ret;
}